

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *__nptr;
  ggml_context *ctx0;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  ulong uVar8;
  int i;
  uint uVar9;
  long lVar10;
  ggml_tensor *x [2];
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  long local_78 [4];
  long local_58;
  long lStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  __nptr = getenv("GGML_NLOOP");
  if (__nptr == (char *)0x0) {
    uVar1 = 500;
  }
  else {
    uVar1 = atoi(__nptr);
  }
  if (1 < argc) {
    uVar1 = atoi(argv[1]);
  }
  if (0 < (int)uVar1) {
    local_58 = 1;
    lStack_50 = 1;
    uStack_48 = 1;
    uStack_40 = 1;
    uVar8 = 0;
    do {
      printf("test-mul-mat0: iter:%d/%d\n",uVar8,(ulong)uVar1);
      ctx0 = (ggml_context *)ggml_init();
      local_78[0] = local_58;
      local_78[1] = lStack_50;
      local_78[2] = uStack_48;
      local_78[3] = uStack_40;
      lVar10 = 0;
      do {
        iVar2 = rand();
        local_78[lVar10] = (long)(iVar2 % 4 + 1);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      uVar9 = 2;
      do {
        pgVar3 = get_random_tensor(ctx0,uVar9,local_78,-1.0,1.0);
        local_88 = pgVar3;
        iVar2 = rand();
        local_78[1] = (long)(iVar2 % 4 + 1);
        pgVar4 = get_random_tensor(ctx0,uVar9,local_78,-1.0,1.0);
        local_80 = pgVar4;
        ggml_set_param(ctx0,pgVar3);
        pgVar5 = (ggml_tensor *)ggml_mul_mat(ctx0,pgVar4,pgVar3);
        pgVar6 = (ggml_tensor *)ggml_sum(ctx0,pgVar5);
        printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
               ,pgVar5->ne[0],pgVar5->ne[1],pgVar5->ne[2],pgVar5->ne[3],pgVar4->ne[0],pgVar4->ne[1],
               pgVar4->ne[2],pgVar4->ne[3],pgVar3->ne[0],pgVar3->ne[1],pgVar3->ne[2],pgVar3->ne[3]);
        if (pgVar5->ne[0] != pgVar4->ne[1]) {
          __assert_fail("m->ne[0] == x[1]->ne[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x117,"int main(int, const char **)");
        }
        if (pgVar5->ne[1] != pgVar3->ne[1]) {
          __assert_fail("m->ne[1] == x[0]->ne[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x118,"int main(int, const char **)");
        }
        if (pgVar5->ne[2] != pgVar3->ne[2]) {
          __assert_fail("m->ne[2] == x[0]->ne[2]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x119,"int main(int, const char **)");
        }
        if (pgVar5->ne[3] != pgVar3->ne[3]) {
          __assert_fail("m->ne[3] == x[0]->ne[3]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x11a,"int main(int, const char **)");
        }
        if (uVar9 < 3) {
          check_gradient("mul_mat",ctx0,&local_88,pgVar6,uVar9,1,0.001,0.001,INFINITY);
        }
        else {
          uVar7 = ggml_new_graph(ctx0);
          ggml_build_forward_expand(uVar7,pgVar5);
          ggml_graph_compute_with_ctx(ctx0,uVar7,1);
        }
        check_mat_mul(pgVar5,pgVar4,pgVar3);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 5);
      uVar9 = 2;
      do {
        pgVar3 = get_random_tensor(ctx0,uVar9,local_78,-1.0,1.0);
        local_78[1] = local_78[0];
        local_88 = pgVar3;
        iVar2 = rand();
        local_78[0] = (long)(iVar2 % 4 + 1);
        pgVar4 = get_random_tensor(ctx0,uVar9,local_78,-1.0,1.0);
        uVar7 = ggml_transpose(ctx0,pgVar4);
        pgVar4 = (ggml_tensor *)ggml_cont(ctx0,uVar7);
        local_80 = pgVar4;
        ggml_set_param(ctx0,pgVar3);
        pgVar5 = (ggml_tensor *)ggml_mul_mat(ctx0,pgVar4,pgVar3);
        pgVar6 = (ggml_tensor *)ggml_sum(ctx0,pgVar5);
        printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
               ,pgVar5->ne[0],pgVar5->ne[1],pgVar5->ne[2],pgVar5->ne[3],pgVar4->ne[0],pgVar4->ne[1],
               pgVar4->ne[2],pgVar4->ne[3],pgVar3->ne[0],pgVar3->ne[1],pgVar3->ne[2],pgVar3->ne[3]);
        if (pgVar5->ne[0] != pgVar4->ne[1]) {
          __assert_fail("m->ne[0] == x[1]->ne[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x13c,"int main(int, const char **)");
        }
        if (pgVar5->ne[1] != pgVar3->ne[1]) {
          __assert_fail("m->ne[1] == x[0]->ne[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x13d,"int main(int, const char **)");
        }
        if (pgVar5->ne[2] != pgVar3->ne[2]) {
          __assert_fail("m->ne[2] == x[0]->ne[2]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x13e,"int main(int, const char **)");
        }
        if (pgVar5->ne[3] != pgVar3->ne[3]) {
          __assert_fail("m->ne[3] == x[0]->ne[3]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                        ,0x13f,"int main(int, const char **)");
        }
        if (uVar9 < 3) {
          check_gradient("mul_mat",ctx0,&local_88,pgVar6,uVar9,1,0.001,0.001,INFINITY);
        }
        else {
          uVar7 = ggml_new_graph(ctx0);
          ggml_build_forward_expand(uVar7,pgVar5);
          ggml_graph_compute_with_ctx(ctx0,uVar7,1);
        }
        check_mat_mul(pgVar5,pgVar4,pgVar3);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 5);
      ggml_free(ctx0);
      uVar9 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar9;
    } while (uVar9 != uVar1);
  }
  return 0;
}

Assistant:

int main(int argc, const char ** argv) {
    struct ggml_init_params params = {
        .mem_size   = 128*1024*1024,
        .mem_buffer = NULL,
        .no_alloc   = false,
    };

    int64_t ne[4];

    // original loop: 500
    int niter = 500;
    const char *env = getenv("GGML_NLOOP");
    if (env != NULL) {
        niter = atoi(env);
    }
    if (argc > 1) {
        niter = atoi(argv[1]);
    }

    int n_threads = 1;

    for (int iter = 0; iter < niter; ++iter) {
        printf("test-mul-mat0: iter:%d/%d\n", iter, niter);
        struct ggml_context * ctx0 = ggml_init(params);

        get_random_dims(ne, 4);

        struct ggml_tensor * x[MAX_NARGS];

        // mul_mat
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = rand()%4 + 1;
                x[1] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }

        // mul_mat (transposed)
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = ne[0];
                ne[0] = rand()%4 + 1;
                x[1] = ggml_cont(ctx0, ggml_transpose(ctx0, get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f)));

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }
        ggml_free(ctx0);
    }

    return 0;
}